

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> *this,char *__from,char *__to)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  tuple<double,_int,_double,_long> tStack_68;
  tuple<double,_int,_double,_long> local_48;
  
  plVar3 = this->first_;
  if ((char *)*plVar3 == __to) {
    if (__to != (char *)0xffffffffffffffff) {
      HighsNodeQueue::NodeLowerRbTree::getKey(&local_48,(NodeLowerRbTree *)this,(HighsInt)__from);
      HighsNodeQueue::NodeLowerRbTree::getKey(&tStack_68,(NodeLowerRbTree *)this,(HighsInt)__to);
      bVar1 = std::
              __tuple_compare<std::tuple<double,_int,_double,_long>,_std::tuple<double,_int,_double,_long>,_0UL,_4UL>
              ::__less(&local_48,&tStack_68);
      if (!bVar1) goto LAB_002d42b8;
      plVar3 = this->first_;
    }
    *plVar3 = (long)__from;
  }
LAB_002d42b8:
  iVar2 = RbTree<HighsNodeQueue::NodeLowerRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::NodeLowerRbTree>,__from,__to);
  return iVar2;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }